

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckValgrindOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  cmCTest *pcVar1;
  value_type_conflict3 vVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ostream *poVar6;
  size_type sVar7;
  void *this_00;
  char *pcVar8;
  reference pvVar9;
  reference pvVar10;
  reference puVar11;
  string local_15c8 [32];
  string local_15a8 [32];
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1588;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1580;
  cmDuration local_1578;
  undefined1 local_1570 [8];
  ostringstream cmCTestLog_msg_3;
  size_type i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  value_type *line;
  string local_13c8 [4];
  int failure;
  undefined1 local_13a8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_1230 [32];
  undefined1 local_1210 [8];
  ostringstream cmCTestLog_msg_1;
  ulong local_1098;
  size_type totalOutputSize;
  undefined1 local_1070 [8];
  ostringstream cmCTestLog_msg;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_ef8;
  time_point sttime;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonValGrindOutput;
  RegularExpression vgABR;
  RegularExpression vgIPW;
  RegularExpression vgUMR5;
  RegularExpression vgUMR4;
  RegularExpression vgUMR3;
  RegularExpression vgUMR2;
  RegularExpression vgUMR1;
  RegularExpression vgUMC;
  RegularExpression vgMPK2;
  RegularExpression vgMPK1;
  RegularExpression vgPAR;
  RegularExpression vgMLK2;
  RegularExpression vgMLK1;
  RegularExpression vgFMM;
  RegularExpression vgFIM;
  RegularExpression valgrindLine;
  undefined1 local_1d0 [4];
  int defects;
  ostringstream ostr;
  value_type_conflict3 local_58;
  size_type cc;
  bool unlimitedOutput;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<int,_std::allocator<int>_> *results_local;
  string *log_local;
  string *str_local;
  cmCTestMemCheckHandler *this_local;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)results;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  cmsys::SystemTools::Split
            (str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
  cc._3_1_ = 0;
  lVar5 = std::__cxx11::string::find((char *)str,0xe01b8b);
  if ((lVar5 != -1) || ((this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize == 0)) {
    cc._3_1_ = 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__cxx11::string::clear();
  valgrindLine._204_4_ = 0;
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgFIM.progsize,"^==[0-9][0-9]*==");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgFMM.progsize,"== .*Invalid free\\(\\) / delete / delete\\[\\]")
  ;
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgMLK1.progsize,
             "== .*Mismatched free\\(\\) / delete / delete \\[\\]");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgMLK2.progsize,
             "== .*[0-9,]+ bytes in [0-9,]+ blocks are definitely lost in loss record [0-9,]+ of [0-9,]+"
            );
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgPAR.progsize,
             "== .*[0-9,]+ \\([0-9,]+ direct, [0-9,]+ indirect\\) bytes in [0-9,]+ blocks are definitely lost in loss record [0-9,]+ of [0-9,]+"
            );
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgMPK1.progsize,
             "== .*Syscall param .* (contains|points to) unaddressable byte\\(s\\)");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgMPK2.progsize,
             "== .*[0-9,]+ bytes in [0-9,]+ blocks are possibly lost in loss record [0-9,]+ of [0-9,]+"
            );
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgUMC.progsize,
             "== .*[0-9,]+ bytes in [0-9,]+ blocks are still reachable in loss record [0-9,]+ of [0-9,]+"
            );
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgUMR1.progsize,
             "== .*Conditional jump or move depends on uninitialised value\\(s\\)");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgUMR2.progsize,"== .*Use of uninitialised value of size [0-9,]+"
            );
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgUMR3.progsize,"== .*Invalid read of size [0-9,]+");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgUMR4.progsize,"== .*Jump to the invalid address ");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgUMR5.progsize,
             "== .*Syscall param .* contains uninitialised or unaddressable byte\\(s\\)");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgIPW.progsize,"== .*Syscall param .* uninitialised");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&vgABR.progsize,"== .*Invalid write of size [0-9,]+");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)
             &nonValGrindOutput.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             "== .*pthread_mutex_unlock: mutex is locked by a different thread");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime);
  local_ef8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1070);
  poVar6 = std::operator<<((ostream *)local_1070,"Start test: ");
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
  this_00 = (void *)std::ostream::operator<<(poVar6,sVar7);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x3d3,pcVar8,
               (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
  std::__cxx11::string::~string((string *)&totalOutputSize);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1070);
  local_1098 = 0;
  for (local_58 = 0; vVar2 = local_58,
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40), vVar2 < sVar7; local_58 = local_58 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1210);
    poVar6 = std::operator<<((ostream *)local_1210,"test line ");
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40,local_58);
    poVar6 = std::operator<<(poVar6,(string *)pvVar9);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x3d7,pcVar8,
                 (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
    std::__cxx11::string::~string(local_1230);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1210);
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40,local_58);
    bVar3 = cmsys::RegularExpression::find((RegularExpression *)&vgFIM.progsize,pvVar9);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13a8);
      poVar6 = std::operator<<((ostream *)local_13a8,"valgrind  line ");
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,local_58);
      poVar6 = std::operator<<(poVar6,(string *)pvVar9);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x3dc,pcVar8,
                   (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
      std::__cxx11::string::~string(local_13c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13a8);
      line._4_4_ = 0x16;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,local_58);
      bVar3 = cmsys::RegularExpression::find((RegularExpression *)&vgFMM.progsize,pvVar9);
      if (bVar3) {
        line._4_4_ = 6;
      }
      else {
        bVar3 = cmsys::RegularExpression::find((RegularExpression *)&vgMLK1.progsize,pvVar9);
        if (bVar3) {
          line._4_4_ = 7;
        }
        else {
          bVar3 = cmsys::RegularExpression::find((RegularExpression *)&vgMLK2.progsize,pvVar9);
          if ((bVar3) ||
             (bVar3 = cmsys::RegularExpression::find((RegularExpression *)&vgPAR.progsize,pvVar9),
             bVar3)) {
            line._4_4_ = 0xe;
          }
          else {
            bVar3 = cmsys::RegularExpression::find((RegularExpression *)&vgMPK1.progsize,pvVar9);
            if (bVar3) {
              line._4_4_ = 0x12;
            }
            else {
              bVar3 = cmsys::RegularExpression::find((RegularExpression *)&vgMPK2.progsize,pvVar9);
              if ((bVar3) ||
                 (bVar3 = cmsys::RegularExpression::find
                                    ((RegularExpression *)&vgUMC.progsize,pvVar9), bVar3)) {
                line._4_4_ = 0xf;
              }
              else {
                bVar3 = cmsys::RegularExpression::find((RegularExpression *)&vgUMR1.progsize,pvVar9)
                ;
                if (bVar3) {
                  line._4_4_ = 0x14;
                }
                else {
                  bVar3 = cmsys::RegularExpression::find
                                    ((RegularExpression *)&vgUMR2.progsize,pvVar9);
                  if ((((bVar3) ||
                       (bVar3 = cmsys::RegularExpression::find
                                          ((RegularExpression *)&vgUMR3.progsize,pvVar9), bVar3)) ||
                      (bVar3 = cmsys::RegularExpression::find
                                         ((RegularExpression *)&vgUMR4.progsize,pvVar9), bVar3)) ||
                     ((bVar3 = cmsys::RegularExpression::find
                                         ((RegularExpression *)&vgUMR5.progsize,pvVar9), bVar3 ||
                      (bVar3 = cmsys::RegularExpression::find
                                         ((RegularExpression *)&vgIPW.progsize,pvVar9), bVar3)))) {
                    line._4_4_ = 0x15;
                  }
                  else {
                    bVar3 = cmsys::RegularExpression::find
                                      ((RegularExpression *)&vgABR.progsize,pvVar9);
                    if (bVar3) {
                      line._4_4_ = 0xc;
                    }
                    else {
                      bVar3 = cmsys::RegularExpression::find
                                        ((RegularExpression *)
                                         &nonValGrindOutput.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9)
                      ;
                      if (bVar3) {
                        line._4_4_ = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (line._4_4_ != 0x16) {
        poVar6 = std::operator<<((ostream *)local_1d0,"<b>");
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->ResultStrings,(long)line._4_4_);
        poVar6 = std::operator<<(poVar6,(string *)pvVar9);
        std::operator<<(poVar6,"</b> ");
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)
                             lines.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)line._4_4_);
        *pvVar10 = *pvVar10 + 1;
        valgrindLine._204_4_ = valgrindLine._204_4_ + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40,local_58);
      lVar5 = std::__cxx11::string::size();
      local_1098 = local_1098 + lVar5;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_40,local_58);
      poVar6 = std::operator<<((ostream *)local_1d0,(string *)pvVar9);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime,&local_58);
    }
  }
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime);
  i = (size_type)
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&i);
    if (!bVar3) {
LAB_009bf41c:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1570);
      poVar6 = std::operator<<((ostream *)local_1570,"End test (elapsed: ");
      local_1588.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_1580.__r = (rep)std::chrono::operator-(&local_1588,&local_ef8);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_1578,&local_1580);
      uVar4 = cmDurationTo<unsigned_int>(&local_1578);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
      poVar6 = std::operator<<(poVar6,"s)");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x415,pcVar8,
                   (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
      std::__cxx11::string::~string(local_15a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1570);
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)log,local_15c8);
      std::__cxx11::string::~string(local_15c8);
      this->DefectCount = valgrindLine._204_4_ + this->DefectCount;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sttime);
      cmsys::RegularExpression::~RegularExpression
                ((RegularExpression *)
                 &nonValGrindOutput.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgABR.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgIPW.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgUMR5.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgUMR4.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgUMR3.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgUMR2.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgUMR1.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgUMC.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgMPK2.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgMPK1.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgPAR.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgMLK2.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgMLK1.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgFMM.progsize);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&vgFIM.progsize);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      return valgrindLine._204_4_ == 0;
    }
    puVar11 = __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&__end1);
    sVar7 = *puVar11;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40,sVar7);
    lVar5 = std::__cxx11::string::size();
    local_1098 = local_1098 + lVar5;
    pvVar9 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40,sVar7);
    poVar6 = std::operator<<((ostream *)local_1d0,(string *)pvVar9);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    if (((cc._3_1_ & 1) == 0) &&
       ((ulong)(long)(this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize < local_1098
       )) {
      std::operator<<((ostream *)local_1d0,"....\n");
      std::operator<<((ostream *)local_1d0,
                      "Test Output for this test has been truncated see testing machine logs for full output,\n"
                     );
      std::operator<<((ostream *)local_1d0,
                      "or put CTEST_FULL_OUTPUT in the output of this test program.\n");
      goto LAB_009bf41c;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckValgrindOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  bool unlimitedOutput = false;
  if (str.find("CTEST_FULL_OUTPUT") != std::string::npos ||
      this->CustomMaximumFailedTestOutputSize == 0) {
    unlimitedOutput = true;
  }

  std::string::size_type cc;

  std::ostringstream ostr;
  log.clear();

  int defects = 0;

  cmsys::RegularExpression valgrindLine("^==[0-9][0-9]*==");

  cmsys::RegularExpression vgFIM(
    R"(== .*Invalid free\(\) / delete / delete\[\])");
  cmsys::RegularExpression vgFMM(
    R"(== .*Mismatched free\(\) / delete / delete \[\])");
  cmsys::RegularExpression vgMLK1(
    "== .*[0-9,]+ bytes in [0-9,]+ blocks are definitely lost"
    " in loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgMLK2(
    "== .*[0-9,]+ \\([0-9,]+ direct, [0-9,]+ indirect\\)"
    " bytes in [0-9,]+ blocks are definitely lost"
    " in loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgPAR(
    "== .*Syscall param .* (contains|points to) unaddressable byte\\(s\\)");
  cmsys::RegularExpression vgMPK1(
    "== .*[0-9,]+ bytes in [0-9,]+ blocks are possibly lost in"
    " loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgMPK2(
    "== .*[0-9,]+ bytes in [0-9,]+ blocks are still reachable"
    " in loss record [0-9,]+ of [0-9,]+");
  cmsys::RegularExpression vgUMC(
    "== .*Conditional jump or move depends on uninitialised value\\(s\\)");
  cmsys::RegularExpression vgUMR1(
    "== .*Use of uninitialised value of size [0-9,]+");
  cmsys::RegularExpression vgUMR2("== .*Invalid read of size [0-9,]+");
  cmsys::RegularExpression vgUMR3("== .*Jump to the invalid address ");
  cmsys::RegularExpression vgUMR4(
    "== .*Syscall param .* contains "
    "uninitialised or unaddressable byte\\(s\\)");
  cmsys::RegularExpression vgUMR5("== .*Syscall param .* uninitialised");
  cmsys::RegularExpression vgIPW("== .*Invalid write of size [0-9,]+");
  cmsys::RegularExpression vgABR("== .*pthread_mutex_unlock: mutex is "
                                 "locked by a different thread");
  std::vector<std::string::size_type> nonValGrindOutput;
  auto sttime = std::chrono::steady_clock::now();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Start test: " << lines.size() << std::endl, this->Quiet);
  std::string::size_type totalOutputSize = 0;
  for (cc = 0; cc < lines.size(); cc++) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "test line " << lines[cc] << std::endl, this->Quiet);

    if (valgrindLine.find(lines[cc])) {
      cmCTestOptionalLog(this->CTest, DEBUG,
                         "valgrind  line " << lines[cc] << std::endl,
                         this->Quiet);
      int failure = cmCTestMemCheckHandler::NO_MEMORY_FAULT;
      auto& line = lines[cc];
      if (vgFIM.find(line)) {
        failure = cmCTestMemCheckHandler::FIM;
      } else if (vgFMM.find(line)) {
        failure = cmCTestMemCheckHandler::FMM;
      } else if (vgMLK1.find(line) || vgMLK2.find(line)) {
        failure = cmCTestMemCheckHandler::MLK;
      } else if (vgPAR.find(line)) {
        failure = cmCTestMemCheckHandler::PAR;
      } else if (vgMPK1.find(line) || vgMPK2.find(line)) {
        failure = cmCTestMemCheckHandler::MPK;
      } else if (vgUMC.find(line)) {
        failure = cmCTestMemCheckHandler::UMC;
      } else if (vgUMR1.find(line) || vgUMR2.find(line) || vgUMR3.find(line) ||
                 vgUMR4.find(line) || vgUMR5.find(line)) {
        failure = cmCTestMemCheckHandler::UMR;
      } else if (vgIPW.find(line)) {
        failure = cmCTestMemCheckHandler::IPW;
      } else if (vgABR.find(line)) {
        failure = cmCTestMemCheckHandler::ABR;
      }

      if (failure != cmCTestMemCheckHandler::NO_MEMORY_FAULT) {
        ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
        results[failure]++;
        defects++;
      }
      totalOutputSize += lines[cc].size();
      ostr << lines[cc] << std::endl;
    } else {
      nonValGrindOutput.push_back(cc);
    }
  }
  // Now put all all the non valgrind output into the test output
  // This should be last in case it gets truncated by the output
  // limiting code
  for (std::string::size_type i : nonValGrindOutput) {
    totalOutputSize += lines[i].size();
    ostr << lines[i] << std::endl;
    if (!unlimitedOutput &&
        totalOutputSize >
          static_cast<size_t>(this->CustomMaximumFailedTestOutputSize)) {
      ostr << "....\n";
      ostr << "Test Output for this test has been truncated see testing"
              " machine logs for full output,\n";
      ostr << "or put CTEST_FULL_OUTPUT in the output of "
              "this test program.\n";
      break; // stop the copy of output if we are full
    }
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "End test (elapsed: "
                       << cmDurationTo<unsigned int>(
                            std::chrono::steady_clock::now() - sttime)
                       << "s)" << std::endl,
                     this->Quiet);
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}